

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QObject_const*,QStyleAnimation*>::emplace<QStyleAnimation*const&>
          (QHash<const_QObject_*,_QStyleAnimation_*> *this,QObject **key,QStyleAnimation **args)

{
  long lVar1;
  bool bVar2;
  QObject **in_RDX;
  QHash<const_QObject_*,_QStyleAnimation_*> *in_RSI;
  QStyleAnimation **in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<const_QObject_*,_QStyleAnimation_*> copy;
  QHash<const_QObject_*,_QStyleAnimation_*> *in_stack_ffffffffffffffa8;
  QHash<const_QObject_*,_QStyleAnimation_*> *in_stack_ffffffffffffffb0;
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<const_QObject_*,_QStyleAnimation_*>::isDetached(in_stack_ffffffffffffffb0);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_>::shouldGrow
                      ((Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> *)*in_RDI);
    if (bVar2) {
      local_28 = (undefined1  [16])emplace_helper<QStyleAnimation*>(in_RSI,in_RDX,in_RDI);
    }
    else {
      local_28 = (undefined1  [16])emplace_helper<QStyleAnimation*const&>(in_RSI,in_RDX,in_RDI);
    }
  }
  else {
    QHash<const_QObject_*,_QStyleAnimation_*>::QHash
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    QHash<const_QObject_*,_QStyleAnimation_*>::detach(in_stack_ffffffffffffffb0);
    local_28 = (undefined1  [16])emplace_helper<QStyleAnimation*const&>(in_RSI,in_RDX,in_RDI);
    QHash<const_QObject_*,_QStyleAnimation_*>::~QHash(in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> *)local_28._0_8_;
    iVar3.i.bucket = local_28._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }